

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O2

void __thiscall
soul::Compiler::compileAllModules
          (Compiler *this,Namespace *parentNamespace,Program *program,ProcessorBase *processorToRun)

{
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> sourceModules;
  ArrayView<soul::pool_ref<soul::Module>_> targetModules;
  pointer ppVar1;
  int iVar2;
  ModuleBase *pMVar3;
  int index;
  pointer ppVar4;
  bool bVar5;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  soulModules;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> heartModules;
  _Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_88;
  _Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
  local_68;
  ProcessorBase *local_48;
  pool_ptr<soul::AST::ModuleBase> local_40;
  pool_ref<soul::Module> local_38;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pool_ref<soul::AST::ModuleBase> *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pool_ref<soul::AST::ModuleBase> *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = processorToRun;
  ASTUtilities::findAllModulesToCompile
            (parentNamespace,
             (vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
              *)&local_88);
  local_68._M_impl.super__Vector_impl_data._M_start = (pool_ref<soul::Module> *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pool_ref<soul::Module> *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::reserve
            ((vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *
             )&local_68,
             (long)local_88._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar1 = local_88._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = local_88._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar4 == ppVar1) {
      sourceModules.e = local_88._M_impl.super__Vector_impl_data._M_finish;
      sourceModules.s = local_88._M_impl.super__Vector_impl_data._M_start;
      targetModules.e = local_68._M_impl.super__Vector_impl_data._M_finish;
      targetModules.s = local_68._M_impl.super__Vector_impl_data._M_start;
      HEARTGenerator::build(sourceModules,targetModules,0xff);
      std::
      _Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
      ~_Vector_base(&local_68);
      std::
      _Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ::~_Vector_base(&local_88);
      return;
    }
    local_40.object = ppVar4->object;
    bVar5 = (ProcessorBase *)local_40.object != local_48;
    pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(&local_40);
    iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[6])(pMVar3);
    index = -(uint)bVar5;
    if ((char)iVar2 == '\0') {
      pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(&local_40);
      iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[5])(pMVar3);
      if ((char)iVar2 == '\0') {
        pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(&local_40);
        iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[4])(pMVar3);
        if ((char)iVar2 == '\0') {
          throwInternalCompilerError("module->isProcessor()","createHEARTModule",0x124);
        }
        local_38.object = Program::addProcessor(program,index);
      }
      else {
        local_38.object = Program::addGraph(program,index);
      }
    }
    else {
      local_38.object = Program::addNamespace(program,index);
    }
    std::vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>::
    emplace_back<soul::pool_ref<soul::Module>>
              ((vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>> *)
               &local_68,&local_38);
    ppVar4 = ppVar4 + 1;
  } while( true );
}

Assistant:

void Compiler::compileAllModules (const AST::Namespace& parentNamespace, Program& program,
                                  AST::ProcessorBase& processorToRun)
{
    std::vector<pool_ref<AST::ModuleBase>> soulModules;
    ASTUtilities::findAllModulesToCompile (parentNamespace, soulModules);

    std::vector<pool_ref<Module>> heartModules;
    heartModules.reserve (soulModules.size());

    for (auto& m : soulModules)
        heartModules.push_back (createHEARTModule (program, m, m == processorToRun));

    HEARTGenerator::build (soulModules, heartModules);
}